

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void GetBaseDelta_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,__m128i *delta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  longlong local_128;
  longlong lStack_120;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i q0_p0;
  __m128i p1_q1;
  __m128i *delta_local;
  __m128i *q1_local;
  __m128i *q0_local;
  __m128i *p0_local;
  __m128i *p1_local;
  
  auVar1 = psubsb((undefined1  [16])*p1,(undefined1  [16])*q1);
  auVar2 = psubsb((undefined1  [16])*q0,(undefined1  [16])*p0);
  auVar1 = paddsb(auVar1,auVar2);
  auVar1 = paddsb(auVar2,auVar1);
  auVar1 = paddsb(auVar2,auVar1);
  local_128 = auVar1._0_8_;
  lStack_120 = auVar1._8_8_;
  (*delta)[0] = local_128;
  (*delta)[1] = lStack_120;
  return;
}

Assistant:

static WEBP_INLINE void GetBaseDelta_SSE2(const __m128i* const p1,
                                          const __m128i* const p0,
                                          const __m128i* const q0,
                                          const __m128i* const q1,
                                          __m128i* const delta) {
  // beware of addition order, for saturation!
  const __m128i p1_q1 = _mm_subs_epi8(*p1, *q1);   // p1 - q1
  const __m128i q0_p0 = _mm_subs_epi8(*q0, *p0);   // q0 - p0
  const __m128i s1 = _mm_adds_epi8(p1_q1, q0_p0);  // p1 - q1 + 1 * (q0 - p0)
  const __m128i s2 = _mm_adds_epi8(q0_p0, s1);     // p1 - q1 + 2 * (q0 - p0)
  const __m128i s3 = _mm_adds_epi8(q0_p0, s2);     // p1 - q1 + 3 * (q0 - p0)
  *delta = s3;
}